

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

bool baryonyx::itm::
     affect<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
               (solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
                *slv,bit_array *x,row_value *it,int k,int selected,int r_size,double kappa,
               double delta)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  rc_data *prVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  undefined8 in_XMM0_Qb;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  pdVar3 = (slv->pi)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  dVar1 = pdVar3[k];
  if (selected < 0) {
    if (r_size != 0) {
      lVar12 = 0;
      auVar15._0_8_ = kappa / (1.0 - kappa);
      auVar15._8_8_ = in_XMM0_Qb;
      auVar5._8_8_ = in_XMM1_Qb;
      auVar5._0_8_ = delta;
      auVar18._8_8_ = 0;
      auVar18._0_8_ =
           ((slv->R)._M_t.
            super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
            ._M_t.
            super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
            .
            super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
           ._M_head_impl)->value * 0.5;
      auVar5 = vfmadd213sd_fma(auVar18,auVar15,auVar5);
      do {
        iVar2 = *(int *)((long)&((slv->R)._M_t.
                                 super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                                 .
                                 super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
                                ._M_head_impl)->id + lVar12);
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
        pdVar3 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl;
        lVar12 = lVar12 + 0x10;
        pdVar3[it[iVar2].value] = pdVar3[it[iVar2].value] - auVar5._0_8_;
      } while ((ulong)(uint)r_size << 4 != lVar12);
    }
  }
  else if ((int)(selected + 1U) < r_size) {
    prVar4 = (slv->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
             ._M_head_impl;
    uVar11 = (ulong)(selected + 1U);
    uVar13 = 0;
    pdVar3[k] = dVar1 + (prVar4[(uint)selected].value + prVar4[uVar11].value) * 0.5;
    auVar14._0_8_ = kappa / (1.0 - kappa);
    auVar14._8_8_ = in_XMM0_Qb;
    auVar6._8_8_ = in_XMM1_Qb;
    auVar6._0_8_ = delta;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = prVar4[uVar11].value - prVar4[(uint)selected].value;
    auVar5 = vfmadd213sd_fma(auVar17,auVar14,auVar6);
    do {
      iVar2 = *(int *)((long)&((slv->R)._M_t.
                               super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                               .
                               super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
                              ._M_head_impl)->id + uVar13);
      bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
      pdVar3 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl;
      uVar13 = uVar13 + 0x10;
      pdVar3[it[iVar2].value] = auVar5._0_8_ + pdVar3[it[iVar2].value];
    } while (uVar11 * 0x10 != uVar13);
    uVar13 = uVar11 * 0x10 | 8;
    lVar12 = (uint)r_size - uVar11;
    do {
      iVar2 = *(int *)((long)&((slv->R)._M_t.
                               super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                               .
                               super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
                              ._M_head_impl)->value + uVar13);
      bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
      pdVar3 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl;
      uVar13 = uVar13 + 0x10;
      lVar12 = lVar12 + -1;
      pdVar3[it[iVar2].value] = pdVar3[it[iVar2].value] - auVar5._0_8_;
    } while (lVar12 != 0);
  }
  else if (r_size != 0) {
    lVar12 = 0;
    auVar16._0_8_ = kappa / (1.0 - kappa);
    auVar16._8_8_ = in_XMM0_Qb;
    auVar7._8_8_ = in_XMM1_Qb;
    auVar7._0_8_ = delta;
    auVar19._8_8_ = 0;
    auVar19._0_8_ =
         (slv->R)._M_t.
         super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
         .
         super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
         ._M_head_impl[(uint)selected].value * 1.5;
    auVar5 = vfmadd213sd_fma(auVar19,auVar16,auVar7);
    do {
      iVar2 = *(int *)((long)&((slv->R)._M_t.
                               super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                               .
                               super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
                              ._M_head_impl)->id + lVar12);
      bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
      pdVar3 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl;
      lVar12 = lVar12 + 0x10;
      pdVar3[it[iVar2].value] = auVar5._0_8_ + pdVar3[it[iVar2].value];
    } while ((ulong)(uint)r_size << 4 != lVar12);
  }
  bVar9 = is_valid_constraint<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array>
                    (slv,k,x);
  if (!bVar9) {
    affect<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
              ();
  }
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar1;
  uVar10 = vmovmskpd_avx(auVar8);
  return (bool)((byte)((byte)(((ulong)uVar10 << 0x3f) >> 0x38) ^
                      (byte)((ulong)(slv->pi)._M_t.
                                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                    .super__Head_base<0UL,_double_*,_false>._M_head_impl[k] >> 0x38)
                      ) >> 7);
}

Assistant:

bool
affect(Solver& slv,
       Xtype& x,
       Iterator it,
       int k,
       int selected,
       int r_size,
       const Float kappa,
       const Float delta)
{
    constexpr Float one{ 1 };
    constexpr Float two{ 2 };
    constexpr Float middle{ (two + one) / two };

    const auto old_pi = slv.pi[k];

    auto d = delta;

    if (selected < 0) {
        // slv.pi[k] += slv.R[0].value / two;
        d += (kappa / (one - kappa)) * (slv.R[0].value / two);

        for (int i = 0; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.set(var->column);
                slv.P[var->value] += d;
            } else {
                x.unset(var->column);
                slv.P[var->value] -= d;
            }
        }
    } else if (selected + 1 >= r_size) {
        // slv.pi[k] += slv.R[selected].value * middle;
        d += (kappa / (one - kappa)) * (slv.R[selected].value * middle);

        for (int i = 0; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.unset(var->column);
                slv.P[var->value] -= d;
            } else {
                x.set(var->column);
                slv.P[var->value] += d;
            }
        }
    } else {
        slv.pi[k] +=
          ((slv.R[selected].value + slv.R[selected + 1].value) / two);
        d += (kappa / (one - kappa)) *
             (slv.R[selected + 1].value - slv.R[selected].value);

        int i = 0;
        for (; i <= selected; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.unset(var->column);
                slv.P[var->value] -= d;
            } else {
                x.set(var->column);
                slv.P[var->value] += d;
            }
        }

        for (; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.set(var->column);
                slv.P[var->value] += d;
            } else {
                x.unset(var->column);
                slv.P[var->value] -= d;
            }
        }
    }

    // TODO job: develops is_valid_constraint for all the solvers
    bx_expects(is_valid_constraint(slv, k, x));

    return is_signbit_change(old_pi, slv.pi[k]);
}